

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O2

int vstumpless_trace_message
              (stumpless_target *target,char *file,int line,char *func,char *message,
              __va_list_tag *subs)

{
  int iVar1;
  
  if (target != (stumpless_target *)0x0) {
    iVar1 = vstumpless_trace_log(target,target->default_prival,file,line,func,message,subs);
    return iVar1;
  }
  raise_argument_empty("target was NULL");
  return -1;
}

Assistant:

int
vstumpless_trace_message( struct stumpless_target *target,
                          const char *file,
                          int line,
                          const char *func,
                          const char *message,
                          va_list subs ) {
  VALIDATE_ARG_NOT_NULL_INT_RETURN( target );

  return vstumpless_trace_log( target,
                               target->default_prival,
                               file,
                               line,
                               func,
                               message,
                               subs );
}